

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

void __thiscall
xsettingsd::SettingsManager::SettingsManager(SettingsManager *this,string *config_filename)

{
  string *config_filename_local;
  SettingsManager *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)config_filename);
  SettingsMap::SettingsMap(&this->settings_);
  this->serial_ = 0;
  this->display_ = (Display *)0x0;
  this->prop_atom_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->windows_);
  return;
}

Assistant:

SettingsManager::SettingsManager(const string& config_filename)
    : config_filename_(config_filename),
      serial_(0),
      display_(NULL),
      prop_atom_(None) {
}